

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O2

void __thiscall tinyxml2::XMLPrinter::PushText(XMLPrinter *this,char *text,bool cdata)

{
  undefined7 in_register_00000011;
  
  this->_textDepth = this->_depth + -1;
  SealElementIfJustOpened(this);
  if ((int)CONCAT71(in_register_00000011,cdata) != 0) {
    Write(this,"<![CDATA[");
    Write(this,text);
    Write(this,"]]>");
    return;
  }
  PrintString(this,text,true);
  return;
}

Assistant:

void XMLPrinter::PushText( const char* text, bool cdata )
{
    _textDepth = _depth-1;

    SealElementIfJustOpened();
    if ( cdata ) {
        Write( "<![CDATA[" );
        Write( text );
        Write( "]]>" );
    }
    else {
        PrintString( text, true );
    }
}